

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbo_linecount.cpp
# Opt level: O0

longlong turbo_linecount_handle(int fhandle,tlc_error_t *error,char **errorstring)

{
  tlc_linecount_t tVar1;
  char *pcVar2;
  longlong linecount;
  tlc_string_t errstr;
  char **errorstring_local;
  tlc_error_t *error_local;
  int fhandle_local;
  
  errstr.field_2._8_8_ = errorstring;
  std::__cxx11::string::string((string *)&linecount);
  tVar1 = TURBOLINECOUNT::CLineCount::LineCount(fhandle,error,(tlc_string_t *)&linecount);
  if (errstr.field_2._8_8_ != 0) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pcVar2 = strdup(pcVar2);
    *(char **)errstr.field_2._8_8_ = pcVar2;
  }
  std::__cxx11::string::~string((string *)&linecount);
  return tVar1;
}

Assistant:

long long turbo_linecount_handle(int fhandle, tlc_error_t * error, char ** errorstring)
#endif
{
	TURBOLINECOUNT::tlc_string_t errstr;

	long long linecount = TURBOLINECOUNT::CLineCount::LineCount(fhandle, error, &errstr);

	if (errorstring)
	{
		*errorstring = _tcsdup(errstr.c_str());
	}

	return linecount;
}